

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<long_double>_>::Subst_Backward
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *B)

{
  double *pdVar1;
  TPZBaseMatrix *pTVar2;
  Fad<long_double> *w;
  Fad<long_double> *pFVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RSI;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *in_RDI;
  int64_t i;
  Fad<long_double> sum;
  int64_t c;
  Fad<long_double> pivot;
  int64_t r;
  Fad<long_double> *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  Fad<long_double> *in_stack_fffffffffffffe30;
  Fad<long_double> *in_stack_fffffffffffffe58;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
  *in_stack_fffffffffffffe68;
  Fad<long_double> *in_stack_fffffffffffffe70;
  undefined1 local_158 [48];
  undefined1 local_128 [48];
  undefined1 local_f8 [64];
  Fad<long_double> *local_b8;
  undefined8 local_b0;
  double *local_60;
  undefined1 local_58 [56];
  Fad<long_double> *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  w = (Fad<long_double> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar3 = (Fad<long_double> *)(**(code **)&(in_RDI->fadexpr_).left_[2].val_)();
  if (((w == pFVar3) && (*(char *)&in_RDI[1].fadexpr_.right_ != '\0')) &&
     (*(char *)&in_RDI[1].fadexpr_.right_ == '\x03')) {
    local_20 = (Fad<long_double> *)(**(code **)&(in_RDI->fadexpr_).left_[2].val_)();
    while (local_20 = (Fad<long_double> *)&local_20[-1].field_0x2f, -1 < (long)local_20) {
      (**(code **)&(in_RDI->fadexpr_).left_[6].val_)(local_58,in_RDI,local_20,local_20);
      local_60 = (double *)0x0;
      while( true ) {
        pdVar1 = local_60;
        iVar4 = TPZBaseMatrix::Cols(local_18);
        if (iVar4 <= (long)pdVar1) break;
        local_b0 = 0;
        Fad<long_double>::Fad<double,_nullptr>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe30 =
             (Fad<long_double> *)(**(code **)&(in_RDI->fadexpr_).left_[2].val_)();
        local_b8 = in_stack_fffffffffffffe30;
        while (pTVar2 = local_18, local_b8 = (Fad<long_double> *)&local_b8[-1].field_0x2f,
              (long)local_20 < (long)local_b8) {
          (**(code **)&(in_RDI->fadexpr_).left_[6].val_)(local_f8,in_RDI,local_20,local_b8);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_128,local_18,local_b8,local_60);
          operator*<Fad<long_double>,_Fad<long_double>,_nullptr>(in_stack_fffffffffffffe58,w);
          Fad<long_double>::operator+=(w,in_RDI);
          FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
                     in_stack_fffffffffffffe20);
          Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
          Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
        }
        in_stack_fffffffffffffe20 = local_20;
        in_stack_fffffffffffffe28 = local_60;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xfffffffffffffe58);
        operator-<Fad<long_double>,_Fad<long_double>,_nullptr>(in_stack_fffffffffffffe58,w);
        operator/<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>,_nullptr>
                  ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)
                   in_stack_fffffffffffffe58,w);
        Fad<long_double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,Fad<long_double>>>,Fad<long_double>>>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (pTVar2,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,local_158);
        Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
                    *)in_stack_fffffffffffffe20);
        FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)
                   in_stack_fffffffffffffe20);
        Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
        Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
        local_60 = (double *)((long)local_60 + 1);
      }
      Fad<long_double>::~Fad(in_stack_fffffffffffffe20);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}